

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_binary_op.cxx
# Opt level: O1

void __thiscall HAXX_BINARY_OP::quaternion_binary_mul::test_method(quaternion_binary_mul *this)

{
  check_is_close_t local_2a9;
  double local_2a8 [2];
  double *local_298;
  double *local_290;
  double *local_288;
  double local_280;
  assertion_result local_278;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  char *local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined8 *local_230;
  double **local_228;
  undefined **local_220;
  undefined1 local_218;
  undefined8 *local_210;
  double **local_208;
  undefined **local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  double **local_1e8;
  char *local_1e0;
  char *local_1d8;
  double K;
  double J;
  double I;
  double S;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  S = -10.340000000000003;
  I = 52.22;
  J = -50.940000000000005;
  K = -22.82;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x10f);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = -10.340000000000003;
  local_2a8[0] = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,(check_is_close_t *)&local_280,-10.340000000000003,S,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1e8 = &local_288;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_290 = &S;
  local_208 = &local_290;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_298 = local_2a8;
  local_228 = &local_298;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x10f,1,8,3,"r.real()",&local_200,"S",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x110);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 52.22;
  local_2a8[0] = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,(check_is_close_t *)&local_280,52.22,I,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = &I;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = local_2a8;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x110,1,8,3,"r.imag_i()",&local_200,"I",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x111);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = -50.940000000000005;
  local_2a8[0] = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,(check_is_close_t *)&local_280,-50.940000000000005,J,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = &J;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = local_2a8;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x111,1,8,3,"r.imag_j()",&local_200,"J",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x112);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = -22.82;
  local_2a8[0] = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,(check_is_close_t *)&local_280,-22.82,K,
             (percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = &K;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = local_2a8;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x112,1,8,3,"r.imag_k()",&local_200,"K",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x114);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 1.0;
  local_2a8[0] = 1.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,1.0,1.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x114,1,8,3,"q.real()",&local_200,"1.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x115);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 2.0;
  local_2a8[0] = 2.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,2.0,2.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x115,1,8,3,"q.imag_i()",&local_200,"2.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x116);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 3.0;
  local_2a8[0] = 3.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,3.0,3.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x116,1,8,3,"q.imag_j()",&local_200,"3.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x117);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 4.0;
  local_2a8[0] = 4.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,4.0,4.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x117,1,8,3,"q.imag_k()",&local_200,"4.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x119);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = -5.0;
  local_2a8[0] = -5.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,-5.0,-5.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x119,1,8,3,"p.real()",&local_200,"-5.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x11a);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 6.94;
  local_2a8[0] = 6.94;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,6.94,6.94,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x11a,1,8,3,"p.imag_i()",&local_200,"6.94",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x11b);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = 7.82;
  local_2a8[0] = 7.82;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,7.82,7.82,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x11b,1,8,3,"p.imag_j()",&local_200,"7.82",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x11c);
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_00151bb0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  local_2a8[1] = -8.0;
  local_2a8[0] = -8.0;
  local_280 = 1e-12;
  boost::test_tools::check_is_close_t::operator()
            (&local_278,&local_2a9,-8.0,-8.0,(percent_tolerance_t<double>)0x3d719799812dea11);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_binary_op.cxx"
  ;
  local_1d8 = "";
  local_288 = local_2a8 + 1;
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00151bf0;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = &local_288;
  local_290 = local_2a8;
  local_218 = 0;
  local_220 = &PTR__lazy_ostream_00151bf0;
  local_210 = &boost::unit_test::lazy_ostream::inst;
  local_208 = &local_290;
  local_298 = &local_280;
  local_238 = 0;
  local_240 = &PTR__lazy_ostream_00151c90;
  local_230 = &boost::unit_test::lazy_ostream::inst;
  local_228 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_260,&local_1e0,0x11c,1,8,3,"p.imag_k()",&local_200,"-8.",&local_220,
             "::boost::math::fpc::percent_tolerance(1e-12)",&local_240);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_binary_mul)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(-5.,6.94,7.82,-8.),r;
  r = p * q;

  double A1 = p.real(), A2 = p.imag_i(), A3 = p.imag_j(), A4 = p.imag_k();
  double B1 = q.real(), B2 = q.imag_i(), B3 = q.imag_j(), B4 = q.imag_k();

  double S = A1 * B1 - A2 * B2 - A3 * B3 - A4 * B4;
  double I = A1 * B2 + A2 * B1 + A3 * B4 - A4 * B3;
  double J = A1 * B3 - A2 * B4 + A3 * B1 + A4 * B2;
  double K = A1 * B4 + A2 * B3 - A3 * B2 + A4 * B1;

  BOOST_CHECK_CLOSE(r.real()  ,S, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_i(),I, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_j(),J, COMPARE_TOL);
  BOOST_CHECK_CLOSE(r.imag_k(),K, COMPARE_TOL);

  BOOST_CHECK_CLOSE(q.real(),1.  , COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_i(),2., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_j(),3., COMPARE_TOL);
  BOOST_CHECK_CLOSE(q.imag_k(),4., COMPARE_TOL);

  BOOST_CHECK_CLOSE(p.real()  ,-5. , COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_i(),6.94, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_j(),7.82, COMPARE_TOL);
  BOOST_CHECK_CLOSE(p.imag_k(),-8. , COMPARE_TOL);


}